

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_thread.hpp
# Opt level: O1

posix_thread * __thiscall oqpi::posix_thread::operator=(posix_thread *this,posix_thread *rhs)

{
  code *pcVar1;
  eAssertResult eVar2;
  posix_thread *ppVar3;
  
  if (this != rhs) {
    if (this->handle_ == 0) {
      this->handle_ = rhs->handle_;
      rhs->handle_ = 0;
    }
    else {
      eVar2 = assert_function("/workspace/llm4binary/github/license_c_cmakelists/H-EAL[P]oqpi/include/oqpi/threading/posix_thread.hpp"
                              ,0x41,"handle_ == 0","");
      if (eVar2 == eAR_Retry) {
        pcVar1 = (code *)swi(3);
        ppVar3 = (posix_thread *)(*pcVar1)();
        return ppVar3;
      }
    }
  }
  return this;
}

Assistant:

posix_thread& operator =(posix_thread &&rhs)
        {
            if (this != &rhs && oqpi_ensure(handle_ == 0))
            {
                handle_     = rhs.handle_;
                rhs.handle_ = 0;
            }
            return (*this);
        }